

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_disk_perms.c
# Opt level: O0

void searchgid(void)

{
  __uid_t __owner;
  int __fd;
  int iVar1;
  undefined1 local_a8 [4];
  int fd;
  stat_conflict st;
  uint local_10;
  uint n;
  gid_t gid;
  uid_t uid;
  
  __owner = getuid();
  if (searchgid::_searched == 0) {
    searchgid::_searched = 1;
    __fd = open("test_gid",0x40,0x1b4);
    failure("Couldn\'t create a file for gid testing.");
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                     ,L'@',(uint)(0 < __fd),"fd > 0",(void *)0x0);
    iVar1 = fstat(__fd,(stat *)local_a8);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                     ,L'C',(uint)(iVar1 == 0),"fstat(fd, &st) == 0",(void *)0x0);
    _default_gid = (long)st.st_mode;
    _invalid_gid = -1;
    st.__glibc_reserved[2]._4_4_ = 1;
    for (local_10 = 1;
        local_10 == st.__glibc_reserved[2]._4_4_ && st.__glibc_reserved[2]._4_4_ < 10000;
        local_10 = local_10 + 1) {
      iVar1 = fchown(__fd,__owner,local_10);
      if (iVar1 != 0) {
        _invalid_gid = (long)local_10;
        break;
      }
      st.__glibc_reserved[2]._4_4_ = st.__glibc_reserved[2]._4_4_ + 1;
    }
    _alt_gid = -1;
    st.__glibc_reserved[2]._4_4_ = 0;
    for (local_10 = 0;
        local_10 == st.__glibc_reserved[2]._4_4_ && st.__glibc_reserved[2]._4_4_ < 10000;
        local_10 = local_10 + 1) {
      if ((local_10 != (uint)_default_gid) && (iVar1 = fchown(__fd,__owner,local_10), iVar1 == 0)) {
        _alt_gid = (long)local_10;
        break;
      }
      st.__glibc_reserved[2]._4_4_ = st.__glibc_reserved[2]._4_4_ + 1;
    }
    close(__fd);
  }
  return;
}

Assistant:

static void
searchgid(void)
{
	static int   _searched = 0;
	uid_t uid = getuid();
	gid_t gid = 0;
	unsigned int n;
	struct stat st;
	int fd;

	/* If we've already looked this up, we're done. */
	if (_searched)
		return;
	_searched = 1;

	/* Create a file on disk in the current default dir. */
	fd = open("test_gid", O_CREAT | O_BINARY, 0664);
	failure("Couldn't create a file for gid testing.");
	assert(fd > 0);

	/* See what GID it ended up with.  This is our "valid" GID. */
	assert(fstat(fd, &st) == 0);
	_default_gid = st.st_gid;

	/* Find a GID for which fchown() fails.  This is our "invalid" GID. */
	_invalid_gid = -1;
	/* This loop stops when we wrap the gid or examine 10,000 gids. */
	for (gid = 1, n = 1; gid == n && n < 10000 ; n++, gid++) {
		if (fchown(fd, uid, gid) != 0) {
			_invalid_gid = gid;
			break;
		}
	}

	/*
	 * Find a GID for which fchown() succeeds, but which isn't the
	 * default.  This is the "alternate" gid.
	 */
	_alt_gid = -1;
	for (gid = 0, n = 0; gid == n && n < 10000 ; n++, gid++) {
		/* _alt_gid must be different than _default_gid */
		if (gid == (gid_t)_default_gid)
			continue;
		if (fchown(fd, uid, gid) == 0) {
			_alt_gid = gid;
			break;
		}
	}
	close(fd);
}